

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

int Aig_TsiStateCount(Aig_Tsi_t *p,uint *pState)

{
  int iVar1;
  uint uVar2;
  bool local_3d;
  int local_34;
  int nCounter;
  int Value;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  uint *pState_local;
  Aig_Tsi_t *p_local;
  
  local_34 = 0;
  for (nCounter = 0; iVar1 = Aig_ManRegNum(p->pAig), nCounter < iVar1; nCounter = nCounter + 1) {
    Aig_ManLi(p->pAig,nCounter);
    Aig_ManLo(p->pAig,nCounter);
    iVar1 = Abc_InfoHasBit(pState,nCounter * 2 + 1);
    uVar2 = Abc_InfoHasBit(pState,nCounter << 1);
    uVar2 = iVar1 << 1 | uVar2;
    local_3d = uVar2 == 1 || uVar2 == 2;
    local_34 = (uint)local_3d + local_34;
  }
  return local_34;
}

Assistant:

int Aig_TsiStateCount( Aig_Tsi_t * p, unsigned * pState )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, Value, nCounter = 0;
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
    }
    return nCounter;
}